

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *t_00;
  TValue *io;
  TValue *io1;
  TValue *slot;
  StkId t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2addr(L,idx);
  if (t_00->tt_ == 0x45) {
    io1 = luaH_getint((Table *)(t_00->value_).gc,n);
    if (io1->tt_ != 0) {
      pTVar1 = L->top;
      pTVar1->value_ = io1->value_;
      uVar2 = *(undefined4 *)&io1->field_0xc;
      pTVar1->tt_ = io1->tt_;
      *(undefined4 *)&pTVar1->field_0xc = uVar2;
      L->top = L->top + 1;
      goto LAB_00119063;
    }
  }
  else {
    io1 = (TValue *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).i = n;
  pTVar1->tt_ = 0x13;
  L->top = L->top + 1;
  luaV_finishget(L,t_00,L->top + -1,L->top + -1,io1);
LAB_00119063:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  const TValue *slot;
  lua_lock(L);
  t = index2value(L, idx);
  if (luaV_fastgeti(L, t, n, slot)) {
    setobj2s(L, L->top, slot);
  }
  else {
    TValue aux;
    setivalue(&aux, n);
    luaV_finishget(L, t, &aux, L->top, slot);
  }
  api_incr_top(L);
  lua_unlock(L);
  return ttype(s2v(L->top - 1));
}